

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.cpp
# Opt level: O3

bool crnlib::texture_conversion::process(convert_params *params,convert_stats *stats)

{
  dynamic_string *this;
  pixel_format fmt;
  format fVar1;
  format fVar2;
  mipmapped_texture *pmVar3;
  mip_level *other;
  void *p;
  uint3 uVar4;
  vector<crnlib::mip_level_*> *pvVar5;
  bool bVar6;
  bool bVar7;
  pixel_format pVar8;
  pixel_format pVar9;
  uint uVar10;
  int iVar11;
  mipmapped_texture *this_00;
  char *pcVar12;
  char *pcVar13;
  mip_level *this_01;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  double dVar17;
  uint uVar18;
  crn_mipmap_params *pcVar19;
  crn_mipmap_params *pcVar20;
  texture_type tVar21;
  byte bVar22;
  face_vec face;
  dynamic_string fn;
  progress_params progress_state;
  dynamic_string ext;
  dynamic_string dir;
  dynamic_string drv;
  uint32 actual_quality_level;
  timer tm;
  crn_mipmap_params mipmap_params;
  timer t;
  ulong local_518;
  format *local_500;
  vector<crnlib::mip_level_*> *local_4f8;
  char *pcStack_4f0;
  double local_4e0;
  dynamic_string local_4d8;
  vector<crnlib::mip_level_*> local_4c8;
  dynamic_string local_4b8;
  dynamic_string local_4a8;
  dynamic_string local_498;
  undefined1 local_488 [20];
  ushort local_474;
  progress_callback_func local_470;
  vector<crnlib::mip_level_*> *pvStack_468;
  undefined8 local_460;
  task_pool *local_458;
  timer local_440;
  crn_mipmap_params local_428;
  long local_3d8;
  dynamic_string local_3d0;
  timer local_3c0;
  crn_comp_params local_3a8;
  
  bVar22 = 0;
  tVar21 = params->m_texture_type;
  memcpy(&local_3a8,&params->m_comp_params,0x378);
  pcVar19 = &params->m_mipmap_params;
  pcVar20 = &local_428;
  for (lVar15 = 0x14; lVar15 != 0; lVar15 = lVar15 + -1) {
    pcVar20->m_size_of_obj = pcVar19->m_size_of_obj;
    pcVar19 = (crn_mipmap_params *)((long)pcVar19 + (ulong)bVar22 * -8 + 4);
    pcVar20 = (crn_mipmap_params *)((long)pcVar20 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  local_4c8.m_capacity._0_1_ = '\0';
  local_4c8.m_size = 0;
  params->m_status = false;
  this = &params->m_error_message;
  local_4c8.m_p = (mip_level **)params;
  dynamic_string::clear(this);
  pmVar3 = params->m_pIntermediate_texture;
  if (pmVar3 != (mipmapped_texture *)0x0) {
    mipmapped_texture::~mipmapped_texture(pmVar3);
    crnlib_free(pmVar3);
    params->m_pIntermediate_texture = (mipmapped_texture *)0x0;
  }
  pmVar3 = params->m_pInput_texture;
  this_00 = (mipmapped_texture *)crnlib_malloc(0x48);
  mipmapped_texture::mipmapped_texture(this_00,pmVar3);
  params->m_pIntermediate_texture = this_00;
  pmVar3 = params->m_pInput_texture;
  if ((params->m_unflip == true) && (bVar6 = mipmapped_texture::is_flipped(pmVar3), bVar6)) {
    console::info("Unflipping texture");
    mipmapped_texture::unflip(pmVar3,true,true);
  }
  if (params->m_y_flip == true) {
    console::info("Flipping texture on Y axis");
    bVar6 = mipmapped_texture::flip_y(pmVar3,params->m_dst_file_type == cFormatKTX);
    if (!bVar6) {
      console::warning("Failed flipping texture on Y axis");
    }
  }
  pVar9 = params->m_dst_format;
  if ((pVar9 == PIXEL_FMT_A8) || (pVar9 == PIXEL_FMT_DXT5A)) {
    if ((pmVar3->m_comp_flags & cCompFlagAValid) == 0) {
      console::warning(
                      "Output format is alpha-only, but input doesn\'t have alpha, so setting alpha to luminance."
                      );
      local_488._8_8_ = (char *)0x4;
      local_488._16_4_ = 0x1000001;
      local_474 = 1;
      local_470 = (progress_callback_func)0x0;
      pvStack_468 = (vector<crnlib::mip_level_*> *)0x0;
      local_488._0_8_ = 0x80;
      local_460._0_4_ = 0;
      local_460._4_4_ = 100;
      local_458 = (task_pool *)0x0;
      mipmapped_texture::convert(pmVar3,PIXEL_FMT_A8,(pack_params *)local_488);
      if (tVar21 == cTextureTypeNormalMap) {
        tVar21 = cTextureTypeRegularMap;
      }
      pVar9 = params->m_dst_format;
    }
LAB_0015ac55:
    if (0x41315843 < (int)pVar9) {
      if ((int)pVar9 < 0x52784778) {
        if ((int)pVar9 < 0x52424741) {
          if ((pVar9 == PIXEL_FMT_DXT1A) || (pVar9 == PIXEL_FMT_ETC2A)) goto LAB_0015ad64;
        }
        else if ((pVar9 == PIXEL_FMT_DXT5_AGBR) || (pVar9 == PIXEL_FMT_DXT5_xGBR))
        goto LAB_0015ad64;
      }
      else if ((int)pVar9 < 0x53413245) {
        if ((pVar9 == PIXEL_FMT_DXT5_xGxR) || (pVar9 == PIXEL_FMT_ETC1S)) goto LAB_0015ad64;
      }
      else if ((pVar9 == PIXEL_FMT_ETC2AS) ||
              ((pVar9 == PIXEL_FMT_DXT5_CCxY || (pVar9 == PIXEL_FMT_DXN)))) goto LAB_0015ad64;
      goto LAB_0015af40;
    }
    if ((int)pVar9 < 0x32495441) {
      if ((int)pVar9 < 0x31545844) {
        if ((pVar9 == PIXEL_FMT_ETC1) || (pVar9 == PIXEL_FMT_DXT5A)) goto LAB_0015ad64;
      }
      else if ((pVar9 == PIXEL_FMT_DXT1) || (pVar9 == PIXEL_FMT_ETC2)) goto LAB_0015ad64;
LAB_0015af40:
      if (pVar9 == PIXEL_FMT_INVALID) goto LAB_0015ad81;
    }
    else {
      if ((int)pVar9 < 0x33545844) {
        if ((pVar9 == PIXEL_FMT_3DC) || (pVar9 == PIXEL_FMT_DXT2)) goto LAB_0015ad64;
        goto LAB_0015af40;
      }
      if ((pVar9 != PIXEL_FMT_DXT3) && ((pVar9 != PIXEL_FMT_DXT4 && (pVar9 != PIXEL_FMT_DXT5))))
      goto LAB_0015af40;
LAB_0015ad64:
      if (2 < (uint)params->m_dst_file_type) {
        console::warning(
                        "Output file format does not support DXTc - automatically choosing a non-DXT pixel format."
                        );
        goto LAB_0015ad81;
      }
    }
LAB_0015ad8e:
    if (pVar9 == PIXEL_FMT_DXT1A) {
LAB_0015ae4d:
      local_3a8.m_flags = local_3a8.m_flags | 0x80;
LAB_0015ae59:
      local_500 = &params->m_dst_file_type;
      pVar8 = PIXEL_FMT_DXT1A;
      if (*local_500 == cFormatCRN) {
        console::warning(
                        "CRN file format does not support DXT1A compressed textures - converting to DXT5 instead."
                        );
        pVar8 = PIXEL_FMT_DXT5;
      }
    }
    else {
      pVar8 = pVar9;
      if (pVar9 == PIXEL_FMT_DXT1) {
LAB_0015adad:
        pVar8 = PIXEL_FMT_DXT1;
        if ((char)local_3a8.m_flags < '\0') goto LAB_0015ae59;
      }
    }
LAB_0015b0b6:
    if (tVar21 == cTextureTypeNormalMap) goto LAB_0015b0c2;
LAB_0015b14f:
    bVar22 = (byte)local_3a8.m_flags;
  }
  else {
    if (pVar9 != PIXEL_FMT_INVALID) goto LAB_0015ac55;
LAB_0015ad81:
    local_500 = &params->m_dst_file_type;
    fmt = pmVar3->m_format;
    pVar9 = fmt;
    if (params->m_always_use_source_pixel_format != false) goto LAB_0015ad8e;
    fVar2 = pmVar3->m_source_file_type;
    fVar1 = *local_500;
    if (fVar1 == cFormatDDS) {
      pVar9 = PIXEL_FMT_DXT5_AGBR;
      if ((uint)fVar2 < 3) {
        pVar9 = fmt;
      }
      if ((uint)fVar2 < 3 || tVar21 == cTextureTypeNormalMap) goto LAB_0015ad8e;
      if (0x41325444 < (int)fmt) {
        if ((int)fmt < 0x41787878) {
          if (((fmt == PIXEL_FMT_ETC2A) || (fmt == PIXEL_FMT_A8R8G8B8)) || (fmt == PIXEL_FMT_A8L8))
          goto LAB_0015b142;
        }
        else if (((fmt == PIXEL_FMT_A8) || (fmt == PIXEL_FMT_DXT5_AGBR)) ||
                (fmt == PIXEL_FMT_ETC2AS)) goto LAB_0015b142;
        goto LAB_0015adad;
      }
      if (0x34545843 < (int)fmt) {
        if (((fmt == PIXEL_FMT_DXT4) || (fmt == PIXEL_FMT_DXT5)) || (fmt == PIXEL_FMT_DXT1A))
        goto LAB_0015b142;
        goto LAB_0015adad;
      }
      if (((fmt != PIXEL_FMT_DXT5A) && (fmt != PIXEL_FMT_DXT2)) && (fmt != PIXEL_FMT_DXT3))
      goto LAB_0015adad;
LAB_0015b142:
      pVar8 = PIXEL_FMT_DXT5;
      if (-1 < (char)local_3a8.m_flags) goto LAB_0015b14f;
      goto LAB_0015ae4d;
    }
    if (fVar1 != cFormatKTX) {
      if (fVar1 == cFormatCRN) {
        if (tVar21 != cTextureTypeNormalMap) goto LAB_0015ad8e;
        tVar21 = cTextureTypeNormalMap;
        pVar8 = PIXEL_FMT_DXT5_AGBR;
        if (0x41315843 < (int)fmt) {
          if ((int)fmt < 0x52784778) {
            if ((int)fmt < 0x52424741) {
              if ((fmt == PIXEL_FMT_DXT1A) || (fmt == PIXEL_FMT_ETC2A)) goto LAB_0015ad8e;
            }
            else if ((fmt == PIXEL_FMT_DXT5_AGBR) || (fmt == PIXEL_FMT_DXT5_xGBR))
            goto LAB_0015ad8e;
          }
          else if ((int)fmt < 0x53413245) {
            if ((fmt == PIXEL_FMT_DXT5_xGxR) || (fmt == PIXEL_FMT_ETC1S)) goto LAB_0015ad8e;
          }
          else if ((fmt == PIXEL_FMT_ETC2AS) ||
                  ((fmt == PIXEL_FMT_DXN || (fmt == PIXEL_FMT_DXT5_CCxY)))) goto LAB_0015ad8e;
          goto LAB_0015b0c2;
        }
        if ((int)fmt < 0x32495441) {
          if ((int)fmt < 0x31545844) {
            if ((fmt == PIXEL_FMT_ETC1) || (fmt == PIXEL_FMT_DXT5A)) goto LAB_0015ad8e;
          }
          else if ((fmt == PIXEL_FMT_DXT1) || (fmt == PIXEL_FMT_ETC2)) goto LAB_0015ad8e;
        }
        else if ((int)fmt < 0x33545844) {
          if ((fmt == PIXEL_FMT_3DC) || (fmt == PIXEL_FMT_DXT2)) goto LAB_0015ad8e;
        }
        else if ((fmt == PIXEL_FMT_DXT3) || ((fmt == PIXEL_FMT_DXT4 || (fmt == PIXEL_FMT_DXT5))))
        goto LAB_0015ad8e;
        goto LAB_0015b0c2;
      }
      if ((int)fmt < 0x41325445) {
        if ((int)fmt < 0x34545844) {
          if (((fmt == PIXEL_FMT_DXT5A) || (fmt == PIXEL_FMT_DXT2)) || (fmt == PIXEL_FMT_DXT3)) {
LAB_0015b0b1:
            pVar8 = PIXEL_FMT_A8R8G8B8;
            goto LAB_0015b0b6;
          }
        }
        else if (((fmt == PIXEL_FMT_DXT4) || (fmt == PIXEL_FMT_DXT5)) || (fmt == PIXEL_FMT_DXT1A))
        goto LAB_0015b0b1;
LAB_0015b09a:
        pVar8 = PIXEL_FMT_R8G8B8;
      }
      else {
        pVar8 = fmt;
        if (0x41787877 < (int)fmt) {
          if ((int)fmt < 0x53413245) {
            if ((fmt == PIXEL_FMT_A8) || (fmt == PIXEL_FMT_DXT5_AGBR)) goto LAB_0015b0b1;
          }
          else {
            if (fmt == PIXEL_FMT_L8) goto LAB_0015b0b6;
            if (fmt == PIXEL_FMT_ETC2AS) goto LAB_0015b0b1;
          }
          goto LAB_0015b09a;
        }
        if ((fmt == PIXEL_FMT_ETC2A) || (fmt == PIXEL_FMT_A8R8G8B8)) goto LAB_0015b0b1;
        if (fmt != PIXEL_FMT_A8L8) goto LAB_0015b09a;
      }
      goto LAB_0015b0b6;
    }
    if ((uint)fVar2 < 3) goto LAB_0015ad8e;
    if (tVar21 != cTextureTypeNormalMap) {
      bVar6 = pixel_format_helpers::has_alpha(fmt);
      pVar8 = PIXEL_FMT_ETC1;
      if (bVar6) {
        pVar8 = PIXEL_FMT_ETC2A;
      }
      goto LAB_0015b14f;
    }
    pVar8 = PIXEL_FMT_R8G8B8;
    if ((int)fmt < 0x41325445) {
      if ((int)fmt < 0x34545844) {
        if (((fmt == PIXEL_FMT_DXT5A) || (fmt == PIXEL_FMT_DXT2)) || (fmt == PIXEL_FMT_DXT3)) {
LAB_0015c1c8:
          pVar8 = PIXEL_FMT_A8R8G8B8;
        }
      }
      else if (((fmt == PIXEL_FMT_DXT4) || (fmt == PIXEL_FMT_DXT5)) || (fmt == PIXEL_FMT_DXT1A))
      goto LAB_0015c1c8;
    }
    else if ((int)fmt < 0x41787878) {
      if (((fmt == PIXEL_FMT_ETC2A) || (fmt == PIXEL_FMT_A8R8G8B8)) || (fmt == PIXEL_FMT_A8L8))
      goto LAB_0015c1c8;
    }
    else if (((fmt == PIXEL_FMT_A8) || (fmt == PIXEL_FMT_ETC2AS)) || (fmt == PIXEL_FMT_DXT5_AGBR))
    goto LAB_0015c1c8;
LAB_0015b0c2:
    local_428.m_gamma_filtering = 0;
    bVar22 = 0;
  }
  local_500 = &params->m_dst_file_type;
  if ((int)pVar8 < 0x52424778) {
    if (((pVar8 == PIXEL_FMT_DXT5A) || (pVar8 == PIXEL_FMT_3DC)) || (pVar8 == PIXEL_FMT_DXT5_AGBR))
    goto LAB_0015b1a7;
  }
  else if ((int)pVar8 < 0x59583241) {
    if ((pVar8 == PIXEL_FMT_DXT5_xGBR) || (pVar8 == PIXEL_FMT_DXT5_xGxR)) {
LAB_0015b1a7:
      if ((bVar22 & 1) != 0) {
        bVar22 = 0;
        console::message(
                        "Output pixel format is swizzled or not RGB, disabling perceptual color metrics"
                        );
      }
    }
  }
  else if ((pVar8 == PIXEL_FMT_DXT5_CCxY) || (pVar8 == PIXEL_FMT_DXN)) goto LAB_0015b1a7;
  if ((int)pVar8 < 0x52424778) {
    if ((pVar8 == PIXEL_FMT_3DC) || (pVar8 == PIXEL_FMT_DXT5_AGBR)) goto LAB_0015b1f4;
  }
  else if ((pVar8 == PIXEL_FMT_DXT5_xGBR) ||
          ((pVar8 == PIXEL_FMT_DXN || (pVar8 == PIXEL_FMT_DXT5_xGxR)))) {
LAB_0015b1f4:
    if ((bVar22 & 1) == 0) {
      bVar22 = 0;
    }
    else {
      bVar22 = 0;
      console::message(
                      "Output pixel format is intended for normal maps, disabling perceptual color metrics"
                      );
    }
  }
  bVar7 = texture_file_types::supports_mipmaps(params->m_dst_file_type);
  fVar2 = params->m_dst_file_type;
  bVar6 = params->m_write_mipmaps_to_multiple_files;
  if (params->m_param_debugging == true) {
    convert_params::print(params);
    console::debug("\nTexture conversion compression parameters:");
    console::debug("          Desired bitrate: %3.3f",SUB84((double)local_3a8.m_target_bitrate,0));
    console::debug("              CRN Quality: %i",(ulong)local_3a8.m_quality_level);
    console::debug("CRN C endpoints/selectors: %u %u",
                   (ulong)local_3a8.m_crn_color_endpoint_palette_size,
                   (ulong)local_3a8.m_crn_color_selector_palette_size);
    console::debug("CRN A endpoints/selectors: %u %u",
                   (ulong)local_3a8.m_crn_alpha_endpoint_palette_size,
                   (ulong)local_3a8.m_crn_alpha_selector_palette_size);
    console::debug("     DXT both block types: %u, Alpha threshold: %u",
                   (ulong)(local_3a8.m_flags >> 3 & 1),(ulong)local_3a8.m_dxt1a_alpha_threshold);
    pcVar12 = crn_get_dxt_quality_string(local_3a8.m_dxt_quality);
    console::debug("  DXT compression quality: %s",pcVar12);
    console::debug("               Perceptual: %u, Large Blocks: %u",(ulong)(local_3a8.m_flags & 1),
                   (ulong)(local_3a8.m_flags >> 1 & 1));
    pcVar12 = get_dxt_compressor_name(local_3a8.m_dxt_compressor_type);
    console::debug("               Compressor: %s",pcVar12);
    console::debug(" Disable endpoint caching: %u",(ulong)(local_3a8.m_flags >> 5 & 1));
    console::debug("       Grayscale sampling: %u",(ulong)(local_3a8.m_flags >> 8 & 1));
    console::debug("       Max helper threads: %u",(ulong)local_3a8.m_num_helper_threads);
    console::debug("");
    console::debug("\nTexture conversion MIP-map parameters:");
    pcVar12 = crn_get_mip_mode_name(local_428.m_mode);
    console::debug("           Mode: %s",pcVar12);
    pcVar12 = crn_get_mip_filter_name(local_428.m_filter);
    console::debug("         Filter: %s",pcVar12);
    console::debug("Gamma filtering: %u, Gamma: %2.2f",SUB84((double)local_428.m_gamma,0),
                   (ulong)local_428.m_gamma_filtering);
    console::debug("     Blurriness: %2.2f",SUB84((double)local_428.m_blurriness,0));
    console::debug("    Renormalize: %u",(ulong)local_428.m_renormalize);
    console::debug("          Tiled: %u",(ulong)local_428.m_tiled);
    console::debug("     Max Levels: %u",(ulong)local_428.m_max_levels);
    console::debug(" Min level size: %u",(ulong)local_428.m_min_mip_size);
    console::debug("       window: %u %u %u %u",(ulong)local_428.m_window_left,
                   (ulong)local_428.m_window_top,(ulong)local_428.m_window_right);
    pcVar12 = crn_get_scale_mode_desc(local_428.m_scale_mode);
    console::debug("   scale mode: %s",pcVar12);
    console::debug("        scale: %f %f",SUB84((double)local_428.m_scale_x,0),
                   (double)local_428.m_scale_y);
    console::debug("        clamp: %u %u, clamp_scale: %u",(ulong)local_428.m_clamp_width,
                   (ulong)local_428.m_clamp_height,(ulong)local_428.m_clamp_scale);
    console::debug("");
  }
  bVar6 = create_texture_mipmaps
                    (pmVar3,&local_3a8,&local_428,(bool)(2 < (uint)fVar2 & bVar6 | bVar7));
  if (!bVar6) {
    params->m_status = false;
    dynamic_string::set(this,"Failed creating texture mipmaps!",0xffffffff);
    pcVar12 = (params->m_dst_filename).m_pStr;
    pcVar13 = "";
    if (pcVar12 != (char *)0x0) {
      pcVar13 = pcVar12;
    }
    remove(pcVar13);
    return false;
  }
  pVar9 = pmVar3->m_format;
  if (pVar9 == pVar8) {
    bVar6 = false;
  }
  else if ((pVar9 == PIXEL_FMT_DXT1A) || (bVar6 = true, pVar9 == PIXEL_FMT_DXT1)) {
    bVar6 = pVar8 != PIXEL_FMT_DXT1A && pVar8 != PIXEL_FMT_DXT1;
  }
  timer::timer(&local_3c0);
  timer::start(&local_3c0);
  fVar2 = *local_500;
  if (fVar2 == cFormatCRN) {
LAB_0015bd16:
    local_3a8.m_file_type = (crn_file_type)(fVar2 != cFormatCRN);
    local_3a8.m_pProgress_func = crn_progress_callback;
    local_3a8.m_pProgress_func_data = &local_4c8;
    local_3a8.m_flags = (uint)(bVar22 & 1) | local_3a8.m_flags & 0xfffffffe;
    local_3a8.m_format = pixel_format_helpers::convert_pixel_format_to_best_crn_format(pVar8);
    pcVar13 = crn_get_format_string(local_3a8.m_format);
    pcVar12 = (params->m_dst_filename).m_pStr;
    if (pcVar12 == (char *)0x0) {
      pcVar12 = "";
    }
    console::message("Writing %s texture to file: \"%s\"",pcVar13,pcVar12);
    pcVar12 = (params->m_dst_filename).m_pStr;
    if (pcVar12 == (char *)0x0) {
      pcVar12 = "";
    }
    bVar6 = mipmapped_texture::write_to_file
                      (pmVar3,pcVar12,params->m_dst_file_type,&local_3a8,(uint32 *)local_488,
                       (float *)&local_440,0);
    if (!bVar6) {
      params->m_status = false;
      dynamic_string::set(this,"Failed writing output file!",0xffffffff);
      pcVar12 = (params->m_dst_filename).m_pStr;
      pcVar13 = "";
      if (pcVar12 != (char *)0x0) {
        pcVar13 = pcVar12;
      }
      remove(pcVar13);
      goto LAB_0015bf12;
    }
  }
  else {
    if (fVar2 != cFormatDDS) goto LAB_0015b6e7;
    if (0x41315843 < (int)pVar8) {
      if ((int)pVar8 < 0x52784778) {
        if ((int)pVar8 < 0x52424741) {
          if ((pVar8 == PIXEL_FMT_DXT1A) || (pVar8 == PIXEL_FMT_ETC2A)) goto LAB_0015b6c5;
        }
        else if ((pVar8 == PIXEL_FMT_DXT5_AGBR) || (pVar8 == PIXEL_FMT_DXT5_xGBR))
        goto LAB_0015b6c5;
      }
      else if ((int)pVar8 < 0x53413245) {
        if ((pVar8 == PIXEL_FMT_DXT5_xGxR) || (pVar8 == PIXEL_FMT_ETC1S)) goto LAB_0015b6c5;
      }
      else if ((pVar8 == PIXEL_FMT_ETC2AS) ||
              ((pVar8 == PIXEL_FMT_DXT5_CCxY || (pVar8 == PIXEL_FMT_DXN)))) goto LAB_0015b6c5;
      goto LAB_0015b6e7;
    }
    if ((int)pVar8 < 0x32495441) {
      if ((int)pVar8 < 0x31545844) {
        if ((pVar8 == PIXEL_FMT_ETC1) || (pVar8 == PIXEL_FMT_DXT5A)) goto LAB_0015b6c5;
      }
      else if ((pVar8 == PIXEL_FMT_DXT1) || (pVar8 == PIXEL_FMT_ETC2)) goto LAB_0015b6c5;
    }
    else if ((int)pVar8 < 0x33545844) {
      if ((pVar8 == PIXEL_FMT_3DC) || (pVar8 == PIXEL_FMT_DXT2)) goto LAB_0015b6c5;
    }
    else if ((pVar8 == PIXEL_FMT_DXT3) || ((pVar8 == PIXEL_FMT_DXT4 || (pVar8 == PIXEL_FMT_DXT5))))
    {
LAB_0015b6c5:
      if ((0.0 < local_3a8.m_target_bitrate) || (local_3a8.m_quality_level < 0xff))
      goto LAB_0015bd16;
    }
LAB_0015b6e7:
    if ((0.0 < local_3a8.m_target_bitrate) || (local_3a8.m_quality_level < 0xff)) {
      console::warning(
                      "Target bitrate/quality level is not supported for this output file format.\n"
                      );
    }
    if (bVar6) {
      local_460._0_4_ = 0;
      local_460._4_4_ = 100;
      local_458 = (task_pool *)0x0;
      local_488._16_4_ = CONCAT31(0x10000,bVar22) & 0xffffff01;
      local_470 = dxt_progress_callback_func;
      pvStack_468 = &local_4c8;
      local_488._8_8_ = CONCAT44(local_3a8.m_dxt_compressor_type,local_3a8.m_dxt_quality);
      uVar4 = CONCAT12((char)(local_3a8.m_flags >> 8),local_488._16_2_);
      local_488._16_4_ = CONCAT13(local_488[0x13],uVar4) & 0xff01ffff;
      if ((local_3a8.m_flags & 0x88) == 0) {
        local_488._16_4_ = uVar4 & 0x1ffff;
      }
      local_488._4_4_ = local_3a8.m_num_helper_threads;
      local_488._0_4_ = local_3a8.m_dxt1a_alpha_threshold;
      local_474 = CONCAT11((byte)local_3a8.m_flags >> 4,(local_3a8.m_flags & 0x20) == 0) & 0x1ff;
      pcVar12 = pixel_format_helpers::get_pixel_format_string(pmVar3->m_format);
      pcVar13 = pixel_format_helpers::get_pixel_format_string(pVar8);
      console::info("Converting texture format from %s to %s",pcVar12,pcVar13);
      timer::timer(&local_440);
      timer::start(&local_440);
      bVar6 = mipmapped_texture::convert(pmVar3,pVar8,(pack_params *)local_488);
      local_4e0 = timer::get_elapsed_secs(&local_440);
      console::info("");
      if (bVar6) {
        console::info("Texture format conversion took %3.3fs",SUB84(local_4e0,0));
        goto LAB_0015b87a;
      }
      if ((char)local_4c8.m_capacity == '\x01') {
        params->m_canceled = true;
      }
      else {
        params->m_status = false;
        pcVar12 = "Failed converting texture to output format!";
LAB_0015beed:
        dynamic_string::set(this,pcVar12,0xffffffff);
        pcVar12 = (params->m_dst_filename).m_pStr;
        pcVar13 = "";
        if (pcVar12 != (char *)0x0) {
          pcVar13 = pcVar12;
        }
        remove(pcVar13);
      }
LAB_0015bf0a:
      bVar6 = false;
      goto LAB_0015bf12;
    }
LAB_0015b87a:
    if (params->m_write_mipmaps_to_multiple_files == true) {
      uVar10 = (pmVar3->m_faces).m_size;
      bVar6 = true;
      if (uVar10 != 0) {
        dVar17 = 0.0;
        do {
          local_3d8 = (long)dVar17 << 4;
          local_518 = 0;
          uVar14 = 1;
          local_4e0 = dVar17;
          while( true ) {
            if (uVar14 == 0) {
              uVar16 = 0;
            }
            else {
              uVar16 = (ulong)((pmVar3->m_faces).m_p)->m_size;
            }
            if (uVar16 <= local_518) break;
            pcVar12 = (params->m_dst_filename).m_pStr;
            if (pcVar12 == (char *)0x0) {
              pcVar12 = "";
            }
            dynamic_string::dynamic_string((dynamic_string *)&local_440,pcVar12);
            local_498.m_buf_size = 0;
            local_498.m_len = 0;
            local_498.m_pStr = (char *)0x0;
            local_4a8.m_buf_size = 0;
            local_4a8.m_len = 0;
            local_4a8.m_pStr = (char *)0x0;
            local_4d8.m_buf_size = 0;
            local_4d8.m_len = 0;
            local_4d8.m_pStr = (char *)0x0;
            local_4b8.m_buf_size = 0;
            local_4b8.m_len = 0;
            local_4b8.m_pStr = (char *)0x0;
            pcVar12 = (params->m_dst_filename).m_pStr;
            if (pcVar12 == (char *)0x0) {
              pcVar12 = "";
            }
            bVar7 = file_utils::split_path(pcVar12,&local_498,&local_4a8,&local_4d8,&local_4b8);
            if (!bVar7) {
              if ((local_4b8.m_pStr != (char *)0x0) &&
                 ((*(uint *)(local_4b8.m_pStr + -8) ^ *(uint *)(local_4b8.m_pStr + -4)) ==
                  0xffffffff)) {
                crnlib_free(local_4b8.m_pStr + -0x10);
              }
              if ((local_4d8.m_pStr != (char *)0x0) &&
                 ((*(uint *)(local_4d8.m_pStr + -8) ^ *(uint *)(local_4d8.m_pStr + -4)) ==
                  0xffffffff)) {
                crnlib_free(local_4d8.m_pStr + -0x10);
              }
              if ((local_4a8.m_pStr != (char *)0x0) &&
                 ((*(uint *)(local_4a8.m_pStr + -8) ^ *(uint *)(local_4a8.m_pStr + -4)) ==
                  0xffffffff)) {
                crnlib_free(local_4a8.m_pStr + -0x10);
              }
              if ((local_498.m_pStr != (char *)0x0) &&
                 ((*(uint *)(local_498.m_pStr + -8) ^ *(uint *)(local_498.m_pStr + -4)) ==
                  0xffffffff)) {
                crnlib_free(local_498.m_pStr + -0x10);
              }
              if (((char *)local_440.m_stop_time != (char *)0x0) &&
                 ((*(uint *)(local_440.m_stop_time + -8) ^ *(uint *)(local_440.m_stop_time + -4)) ==
                  0xffffffff)) {
                crnlib_free((char *)(local_440.m_stop_time + -0x10));
              }
              goto LAB_0015bf0a;
            }
            dynamic_string::dynamic_string
                      ((dynamic_string *)local_488,cVarArg,"_face%u_mip%u",local_4e0);
            pcVar12 = (char *)local_488._8_8_;
            if ((char *)local_488._8_8_ == (char *)0x0) {
              pcVar12 = "";
            }
            dynamic_string::append(&local_4d8,pcVar12);
            if (((char *)local_488._8_8_ != (char *)0x0) &&
               ((*(uint *)(local_488._8_8_ + -8) ^ *(uint *)(local_488._8_8_ + -4)) == 0xffffffff))
            {
              crnlib_free((char *)(local_488._8_8_ + -0x10));
            }
            operator+((crnlib *)&local_3d0,&local_498,&local_4a8);
            operator+((crnlib *)&local_4f8,&local_3d0,&local_4d8);
            operator+((crnlib *)local_488,(dynamic_string *)&local_4f8,&local_4b8);
            dynamic_string::set((dynamic_string *)&local_440,(dynamic_string *)local_488,0xffffffff)
            ;
            if (((char *)local_488._8_8_ != (char *)0x0) &&
               ((*(uint *)(local_488._8_8_ + -8) ^ *(uint *)(local_488._8_8_ + -4)) == 0xffffffff))
            {
              crnlib_free((char *)(local_488._8_8_ + -0x10));
            }
            if ((pcStack_4f0 != (char *)0x0) &&
               ((*(uint *)(pcStack_4f0 + -8) ^ *(uint *)(pcStack_4f0 + -4)) == 0xffffffff)) {
              crnlib_free(pcStack_4f0 + -0x10);
            }
            if ((local_3d0.m_pStr != (char *)0x0) &&
               ((*(uint *)(local_3d0.m_pStr + -8) ^ *(uint *)(local_3d0.m_pStr + -4)) == 0xffffffff)
               ) {
              crnlib_free(local_3d0.m_pStr + -0x10);
            }
            other = *(mip_level **)
                     (*(long *)((long)&((pmVar3->m_faces).m_p)->m_p + local_3d8) + local_518 * 8);
            local_4f8 = (vector<crnlib::mip_level_*> *)0x0;
            pcStack_4f0 = (char *)0x0;
            elemental_vector::increase_capacity
                      ((elemental_vector *)&local_4f8,1,true,0x10,(object_mover)0x0,false);
            if (((ulong)pcStack_4f0 & 0xffffffff) != 1) {
              memset(local_4f8 + ((ulong)pcStack_4f0 & 0xffffffff),0,
                     (ulong)(1 - (uint)pcStack_4f0) << 4);
            }
            pvVar5 = local_4f8;
            pcStack_4f0 = (char *)CONCAT44(pcStack_4f0._4_4_,1);
            this_01 = (mip_level *)crnlib_malloc(0x28);
            mip_level::mip_level(this_01,other);
            uVar18 = pvVar5->m_size;
            if (pvVar5->m_capacity <= uVar18) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)pvVar5,uVar18 + 1,true,8,(object_mover)0x0,false);
              uVar18 = pvVar5->m_size;
            }
            pvVar5->m_p[uVar18] = this_01;
            pvVar5->m_size = pvVar5->m_size + 1;
            mipmapped_texture::mipmapped_texture((mipmapped_texture *)local_488);
            mipmapped_texture::assign((mipmapped_texture *)local_488,(face_vec *)&local_4f8);
            console::info("Writing texture face %u mip level %u to file %s",local_4e0,local_518);
            pcVar12 = (char *)local_440.m_stop_time;
            if ((char *)local_440.m_stop_time == (char *)0x0) {
              pcVar12 = "";
            }
            bVar7 = mipmapped_texture::write_to_file
                              ((mipmapped_texture *)local_488,pcVar12,*local_500,
                               (crn_comp_params *)0x0,(uint32 *)0x0,(float *)0x0,0);
            if (!bVar7) {
              params->m_status = false;
              dynamic_string::set(this,"Failed writing output file!",0xffffffff);
              pcVar12 = (params->m_dst_filename).m_pStr;
              if (pcVar12 == (char *)0x0) {
                pcVar12 = "";
              }
              remove(pcVar12);
            }
            mipmapped_texture::~mipmapped_texture((mipmapped_texture *)local_488);
            pvVar5 = local_4f8;
            if (local_4f8 != (vector<crnlib::mip_level_*> *)0x0) {
              uVar16 = (ulong)pcStack_4f0 & 0xffffffff;
              if (uVar16 != 0) {
                lVar15 = 0;
                do {
                  p = *(void **)((long)&pvVar5->m_p + lVar15);
                  if (p != (void *)0x0) {
                    crnlib_free(p);
                  }
                  lVar15 = lVar15 + 0x10;
                } while (uVar16 << 4 != lVar15);
              }
              crnlib_free(local_4f8);
            }
            if ((local_4b8.m_pStr != (char *)0x0) &&
               ((*(uint *)(local_4b8.m_pStr + -8) ^ *(uint *)(local_4b8.m_pStr + -4)) == 0xffffffff)
               ) {
              crnlib_free(local_4b8.m_pStr + -0x10);
            }
            if ((local_4d8.m_pStr != (char *)0x0) &&
               ((*(uint *)(local_4d8.m_pStr + -8) ^ *(uint *)(local_4d8.m_pStr + -4)) == 0xffffffff)
               ) {
              crnlib_free(local_4d8.m_pStr + -0x10);
            }
            if ((local_4a8.m_pStr != (char *)0x0) &&
               ((*(uint *)(local_4a8.m_pStr + -8) ^ *(uint *)(local_4a8.m_pStr + -4)) == 0xffffffff)
               ) {
              crnlib_free(local_4a8.m_pStr + -0x10);
            }
            if ((local_498.m_pStr != (char *)0x0) &&
               ((*(uint *)(local_498.m_pStr + -8) ^ *(uint *)(local_498.m_pStr + -4)) == 0xffffffff)
               ) {
              crnlib_free(local_498.m_pStr + -0x10);
            }
            if (((char *)local_440.m_stop_time != (char *)0x0) &&
               ((*(uint *)(local_440.m_stop_time + -8) ^ *(uint *)(local_440.m_stop_time + -4)) ==
                0xffffffff)) {
              crnlib_free((char *)(local_440.m_stop_time + -0x10));
            }
            if (!bVar7) goto LAB_0015bf0a;
            local_518 = local_518 + 1;
            uVar10 = (pmVar3->m_faces).m_size;
            uVar14 = uVar10;
          }
          dVar17 = (double)((long)local_4e0 + 1);
        } while ((ulong)dVar17 < (ulong)uVar10);
      }
      goto LAB_0015bf12;
    }
    pcVar12 = (params->m_dst_filename).m_pStr;
    if (pcVar12 == (char *)0x0) {
      pcVar12 = "";
    }
    console::message("Writing texture to file: \"%s\"",pcVar12);
    pcVar12 = (params->m_dst_filename).m_pStr;
    if (pcVar12 == (char *)0x0) {
      pcVar12 = "";
    }
    bVar6 = mipmapped_texture::write_to_file
                      (pmVar3,pcVar12,params->m_dst_file_type,(crn_comp_params *)0x0,(uint32 *)0x0,
                       (float *)0x0,0);
    if (!bVar6) {
      params->m_status = false;
      pcVar12 = "Failed writing output file!";
      goto LAB_0015beed;
    }
    bVar6 = true;
  }
  if (params->m_no_stats == false) {
    pcVar12 = (params->m_pInput_texture->m_name).m_pStr;
    if ((EVP_PKEY_CTX *)pcVar12 == (EVP_PKEY_CTX *)0x0) {
      pcVar12 = "";
    }
    iVar11 = convert_stats::init(stats,(EVP_PKEY_CTX *)pcVar12);
    if ((char)iVar11 == '\0') {
      pcVar12 = (params->m_pInput_texture->m_name).m_pStr;
      pcVar13 = "";
      if (pcVar12 != (char *)0x0) {
        pcVar13 = pcVar12;
      }
      console::warning("Unable to compute output statistics for file: %s",pcVar13);
    }
  }
LAB_0015bf12:
  console::progress("");
  if ((char)local_4c8.m_capacity == '\x01') {
    params->m_canceled = true;
  }
  else {
    dVar17 = timer::get_elapsed_secs(&local_3c0);
    if (bVar6 != false) {
      if (params->m_param_debugging == true) {
        pcVar12 = pixel_format_helpers::get_pixel_format_string(pmVar3->m_format);
        pcVar13 = pixel_format_helpers::get_pixel_format_string(pVar8);
        console::info("Work texture format: %s, desired destination format: %s",pcVar12,pcVar13);
      }
      console::message("Texture successfully written in %3.3fs",SUB84(dVar17,0));
      if (params->m_debugging != false) {
        crnlib_print_mem_stats();
      }
      params->m_status = true;
      return true;
    }
    local_488._0_8_ = local_488._0_8_ & 0xffffffff00000000;
    local_488._8_8_ = (char *)0x0;
    pcVar12 = (params->m_dst_filename).m_pStr;
    if (pcVar12 == (char *)0x0) {
      pcVar12 = "";
    }
    if ((pmVar3->m_last_error).m_len == 0) {
      dynamic_string::format
                ((dynamic_string *)local_488,"Failed writing texture to file \"%s\"",pcVar12);
    }
    else {
      pcVar13 = (pmVar3->m_last_error).m_pStr;
      if (pcVar13 == (char *)0x0) {
        pcVar13 = "";
      }
      dynamic_string::format
                ((dynamic_string *)local_488,"Failed writing texture to file \"%s\", Reason: %s",
                 pcVar12,pcVar13);
    }
    pcVar12 = (char *)local_488._8_8_;
    if ((char *)local_488._8_8_ == (char *)0x0) {
      pcVar12 = "";
    }
    params->m_status = false;
    dynamic_string::set(this,pcVar12,0xffffffff);
    pcVar12 = (params->m_dst_filename).m_pStr;
    pcVar13 = "";
    if (pcVar12 != (char *)0x0) {
      pcVar13 = pcVar12;
    }
    remove(pcVar13);
    if (((char *)local_488._8_8_ != (char *)0x0) &&
       ((*(uint *)(local_488._8_8_ + -8) ^ *(uint *)(local_488._8_8_ + -4)) == 0xffffffff)) {
      crnlib_free((char *)(local_488._8_8_ + -0x10));
    }
  }
  return false;
}

Assistant:

bool process(convert_params& params, convert_stats& stats) {
  texture_type tex_type = params.m_texture_type;

  crn_comp_params comp_params(params.m_comp_params);
  crn_mipmap_params mipmap_params(params.m_mipmap_params);

  progress_params progress_state;
  progress_state.m_pParams = &params;
  progress_state.m_canceled = false;
  progress_state.m_start_percentage = 0;

  params.m_status = false;
  params.m_error_message.clear();

  if (params.m_pIntermediate_texture) {
    crnlib_delete(params.m_pIntermediate_texture);
    params.m_pIntermediate_texture = NULL;
  }

  params.m_pIntermediate_texture = crnlib_new<mipmapped_texture>(*params.m_pInput_texture);

  mipmapped_texture& work_tex = *params.m_pInput_texture;

  if ((params.m_unflip) && (work_tex.is_flipped())) {
    console::info("Unflipping texture");
    work_tex.unflip(true, true);
  }

  if (params.m_y_flip) {
    console::info("Flipping texture on Y axis");

    // This is awkward - if we're writing to KTX, then go ahead and properly update the work texture's orientation flags.
    // Otherwise, don't bother updating the orientation flags because the writer may then attempt to unflip the texture before writing to formats
    // that don't support flipped textures (ugh).
    const bool bOutputFormatSupportsFlippedTextures = params.m_dst_file_type == texture_file_types::cFormatKTX;
    if (!work_tex.flip_y(bOutputFormatSupportsFlippedTextures)) {
      console::warning("Failed flipping texture on Y axis");
    }
  }

  if ((params.m_dst_format != PIXEL_FMT_INVALID) && (pixel_format_helpers::is_alpha_only(params.m_dst_format))) {
    if ((work_tex.get_comp_flags() & pixel_format_helpers::cCompFlagAValid) == 0) {
      console::warning("Output format is alpha-only, but input doesn't have alpha, so setting alpha to luminance.");

      work_tex.convert(PIXEL_FMT_A8, crnlib::dxt_image::pack_params());

      if (tex_type == cTextureTypeNormalMap)
        tex_type = cTextureTypeRegularMap;
    }
  }

  pixel_format dst_format = params.m_dst_format;
  if (pixel_format_helpers::is_dxt(dst_format)) {
    if ((params.m_dst_file_type != texture_file_types::cFormatCRN) &&
        (params.m_dst_file_type != texture_file_types::cFormatDDS) &&
        (params.m_dst_file_type != texture_file_types::cFormatKTX)) {
      console::warning("Output file format does not support DXTc - automatically choosing a non-DXT pixel format.");
      dst_format = PIXEL_FMT_INVALID;
    }
  }

  if (dst_format == PIXEL_FMT_INVALID) {
    // Caller didn't specify a format to use, so try to pick something reasonable.
    // This is actually much trickier than it seems, and the current approach kind of sucks.
    dst_format = choose_pixel_format(params, comp_params, work_tex, tex_type);
  }

  if ((dst_format == PIXEL_FMT_DXT1) && (comp_params.get_flag(cCRNCompFlagDXT1AForTransparency)))
    dst_format = PIXEL_FMT_DXT1A;
  else if (dst_format == PIXEL_FMT_DXT1A)
    comp_params.set_flag(cCRNCompFlagDXT1AForTransparency, true);

  if ((dst_format == PIXEL_FMT_DXT1A) && (params.m_dst_file_type == texture_file_types::cFormatCRN)) {
    console::warning("CRN file format does not support DXT1A compressed textures - converting to DXT5 instead.");
    dst_format = PIXEL_FMT_DXT5;
  }

  const bool is_normal_map = (tex_type == cTextureTypeNormalMap);
  bool perceptual = comp_params.get_flag(cCRNCompFlagPerceptual);
  if (is_normal_map) {
    perceptual = false;
    mipmap_params.m_gamma_filtering = false;
  }

  if (pixel_format_helpers::is_pixel_format_non_srgb(dst_format)) {
    if (perceptual) {
      console::message("Output pixel format is swizzled or not RGB, disabling perceptual color metrics");
      perceptual = false;
    }
  }

  if (pixel_format_helpers::is_normal_map(dst_format)) {
    if (perceptual)
      console::message("Output pixel format is intended for normal maps, disabling perceptual color metrics");

    perceptual = false;
  }

  bool generate_mipmaps = texture_file_types::supports_mipmaps(params.m_dst_file_type);
  if ((params.m_write_mipmaps_to_multiple_files) &&
      ((params.m_dst_file_type != texture_file_types::cFormatCRN) && (params.m_dst_file_type != texture_file_types::cFormatDDS) && (params.m_dst_file_type != texture_file_types::cFormatKTX))) {
    generate_mipmaps = true;
  }

  if (params.m_param_debugging) {
    params.print();

    print_comp_params(comp_params);
    print_mipmap_params(mipmap_params);
  }

  if (!create_texture_mipmaps(work_tex, comp_params, mipmap_params, generate_mipmaps))
    return convert_error(params, "Failed creating texture mipmaps!");

  bool formats_differ = work_tex.get_format() != dst_format;
  if (formats_differ) {
    if (pixel_format_helpers::is_dxt1(work_tex.get_format()) && pixel_format_helpers::is_dxt1(dst_format))
      formats_differ = false;
  }

  bool status = false;

  timer t;
  t.start();

  if ((params.m_dst_file_type == texture_file_types::cFormatCRN) ||
      ((params.m_dst_file_type == texture_file_types::cFormatDDS) && (pixel_format_helpers::is_dxt(dst_format)) &&
       //((formats_differ) || (comp_params.m_target_bitrate > 0.0f) || (comp_params.m_quality_level < cCRNMaxQualityLevel))
       ((comp_params.m_target_bitrate > 0.0f) || (comp_params.m_quality_level < cCRNMaxQualityLevel)))) {
    status = write_compressed_texture(work_tex, params, comp_params, dst_format, progress_state, perceptual, stats);
  } else {
    if ((comp_params.m_target_bitrate > 0.0f) || (comp_params.m_quality_level < cCRNMaxQualityLevel)) {
      console::warning("Target bitrate/quality level is not supported for this output file format.\n");
    }
    status = convert_and_write_normal_texture(work_tex, params, comp_params, dst_format, progress_state, formats_differ, perceptual, stats);
  }

  console::progress("");

  if (progress_state.m_canceled) {
    params.m_canceled = true;
    return false;
  }

  double total_write_time = t.get_elapsed_secs();

  if (status) {
    if (params.m_param_debugging)
      console::info("Work texture format: %s, desired destination format: %s", pixel_format_helpers::get_pixel_format_string(work_tex.get_format()), pixel_format_helpers::get_pixel_format_string(dst_format));

    console::message("Texture successfully written in %3.3fs", total_write_time);
  } else {
    dynamic_string str;

    if (work_tex.get_last_error().is_empty())
      str.format("Failed writing texture to file \"%s\"", params.m_dst_filename.get_ptr());
    else
      str.format("Failed writing texture to file \"%s\", Reason: %s", params.m_dst_filename.get_ptr(), work_tex.get_last_error().get_ptr());

    return convert_error(params, str.get_ptr());
  }

  if (params.m_debugging) {
    crnlib_print_mem_stats();
  }

  params.m_status = true;
  return true;
}